

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageOperations.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayImageOpCompute::deinit(TextureCubeMapArrayImageOpCompute *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureCubeMapArrayImageOpCompute *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 0x78))(0x8ca8,0);
  (**(code **)(lVar3 + 0x1680))(0);
  (**(code **)(lVar3 + 0xd8))(0);
  if (this->m_po_id != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_po_id);
    this->m_po_id = 0;
  }
  if (this->m_cs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_cs_id);
    this->m_cs_id = 0;
  }
  if (this->m_fs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_fs_id);
    this->m_fs_id = 0;
  }
  if (this->m_gs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_gs_id);
    this->m_gs_id = 0;
  }
  if (this->m_tc_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_tc_id);
    this->m_tc_id = 0;
  }
  if (this->m_te_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_te_id);
    this->m_te_id = 0;
  }
  if (this->m_vs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_vs_id);
    this->m_vs_id = 0;
  }
  if (this->m_copy_cs_id != 0) {
    (**(code **)(lVar3 + 0x470))(this->m_copy_cs_id);
    this->m_copy_cs_id = 0;
  }
  if (this->m_copy_po_id != 0) {
    (**(code **)(lVar3 + 0x448))(this->m_copy_po_id);
    this->m_copy_po_id = 0;
  }
  if (this->m_fbo_id != 0) {
    (**(code **)(lVar3 + 0x440))(1,&this->m_fbo_id);
    this->m_fbo_id = 0;
  }
  if (this->m_vao_id != 0) {
    (**(code **)(lVar3 + 0x490))(1,&this->m_vao_id);
    this->m_vao_id = 0;
  }
  removeTextures(this);
  TestCaseBase::deinit(&this->super_TestCaseBase);
  return;
}

Assistant:

void TextureCubeMapArrayImageOpCompute::deinit(void)
{
	/* Get GL entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES configuration */
	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, 0);
	gl.useProgram(0);
	gl.bindVertexArray(0);

	/* Delete GLES objects */
	if (m_po_id != 0)
	{
		gl.deleteProgram(m_po_id);
		m_po_id = 0;
	}
	if (m_cs_id != 0)
	{
		gl.deleteShader(m_cs_id);
		m_cs_id = 0;
	}
	if (m_fs_id != 0)
	{
		gl.deleteShader(m_fs_id);
		m_fs_id = 0;
	}
	if (m_gs_id != 0)
	{
		gl.deleteShader(m_gs_id);
		m_gs_id = 0;
	}
	if (m_tc_id != 0)
	{
		gl.deleteShader(m_tc_id);
		m_tc_id = 0;
	}
	if (m_te_id != 0)
	{
		gl.deleteShader(m_te_id);
		m_te_id = 0;
	}
	if (m_vs_id != 0)
	{
		gl.deleteShader(m_vs_id);
		m_vs_id = 0;
	}
	if (m_copy_cs_id != 0)
	{
		gl.deleteShader(m_copy_cs_id);
		m_copy_cs_id = 0;
	}
	if (m_copy_po_id != 0)
	{
		gl.deleteProgram(m_copy_po_id);
		m_copy_po_id = 0;
	}
	if (m_fbo_id != 0)
	{
		gl.deleteFramebuffers(1, &m_fbo_id);
		m_fbo_id = 0;
	}
	if (m_vao_id != 0)
	{
		gl.deleteVertexArrays(1, &m_vao_id);
		m_vao_id = 0;
	}

	removeTextures();

	/* Deinitialize base class */
	TestCaseBase::deinit();
}